

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O1

ReadFileResult anon_unknown.dwarf_3bdef4::WorkflowStepTypeHelper(Type *out,Value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  ReadFileResult RVar5;
  String local_50;
  
  RVar5 = INVALID_PRESET;
  if ((value != (Value *)0x0) && (bVar2 = Json::Value::isString(value), bVar2)) {
    Json::Value::asString_abi_cxx11_(&local_50,value);
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    TVar4 = Configure;
    if (iVar3 != 0) {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        TVar4 = Build;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_50,value);
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          TVar4 = Test;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_50,value);
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (iVar3 != 0) {
            return INVALID_PRESET;
          }
          TVar4 = Package;
        }
      }
    }
    *out = TVar4;
    RVar5 = READ_OK;
  }
  return RVar5;
}

Assistant:

ReadFileResult WorkflowStepTypeHelper(WorkflowPreset::WorkflowStep::Type& out,
                                      const Json::Value* value)
{
  if (!value) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "configure") {
    out = WorkflowPreset::WorkflowStep::Type::Configure;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "build") {
    out = WorkflowPreset::WorkflowStep::Type::Build;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "test") {
    out = WorkflowPreset::WorkflowStep::Type::Test;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "package") {
    out = WorkflowPreset::WorkflowStep::Type::Package;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}